

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O1

int zstat(char **argv)

{
  int iVar1;
  ulonglong uVar2;
  tm *__tp;
  zip_stat sb;
  tm tm;
  char buf [100];
  byte local_f0;
  byte local_ef;
  char *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  time_t local_c8;
  uint local_c0;
  ushort local_bc;
  ushort local_ba;
  uint local_b8;
  tm local_b0;
  char local_78 [112];
  
  uVar2 = strtoull(*argv,(char **)0x0,10);
  iVar1 = zip_stat_index(za,uVar2,stat_flags,&local_f0);
  if (iVar1 < 0) {
    zstat_cold_1();
    iVar1 = -1;
  }
  else {
    if ((local_f0 & 1) != 0) {
      encode_filename(local_e8);
      printf("name: \'%s\'\n",filename_buffer);
    }
    if ((local_f0 & 2) != 0) {
      printf("index: \'%lu\'\n",local_e0);
    }
    if ((local_f0 & 4) != 0) {
      printf("size: \'%lu\'\n",local_d8);
    }
    if ((local_f0 & 8) != 0) {
      printf("compressed size: \'%lu\'\n",local_d0);
    }
    if ((local_f0 & 0x10) != 0) {
      __tp = localtime_r(&local_c8,&local_b0);
      if (__tp == (tm *)0x0) {
        puts("mtime: <not valid>");
      }
      else {
        strftime(local_78,100,"%a %b %d %Y %H:%M:%S",__tp);
        printf("mtime: \'%s\'\n",local_78);
      }
    }
    if ((local_f0 & 0x20) != 0) {
      printf("crc: \'%0x\'\n",(ulong)local_c0);
    }
    if ((local_f0 & 0x40) != 0) {
      printf("compression method: \'%d\'\n",(ulong)local_bc);
    }
    if ((local_f0 & 0x80) != 0) {
      printf("encryption method: \'%d\'\n",(ulong)local_ba);
    }
    if ((local_ef & 1) != 0) {
      printf("flags: \'%ld\'\n",(ulong)local_b8);
    }
    putchar(10);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
zstat(char *argv[]) {
    zip_uint64_t idx;
    char buf[100];
    struct zip_stat sb;
    idx = strtoull(argv[0], NULL, 10);

    if (zip_stat_index(za, idx, stat_flags, &sb) < 0) {
        fprintf(stderr, "zip_stat_index failed on '%" PRIu64 "' failed: %s\n", idx, zip_strerror(za));
        return -1;
    }

    if (sb.valid & ZIP_STAT_NAME)
        printf("name: '%s'\n", encode_filename(sb.name));
    if (sb.valid & ZIP_STAT_INDEX)
        printf("index: '%" PRIu64 "'\n", sb.index);
    if (sb.valid & ZIP_STAT_SIZE)
        printf("size: '%" PRIu64 "'\n", sb.size);
    if (sb.valid & ZIP_STAT_COMP_SIZE)
        printf("compressed size: '%" PRIu64 "'\n", sb.comp_size);
    if (sb.valid & ZIP_STAT_MTIME) {
        struct tm *tpm;
        struct tm tm;
        tpm = zip_localtime(&sb.mtime, &tm);
        if (tpm == NULL) {
            printf("mtime: <not valid>\n");
        }
        else {
            strftime(buf, sizeof(buf), "%a %b %d %Y %H:%M:%S", tpm);
            printf("mtime: '%s'\n", buf);
        }
    }
    if (sb.valid & ZIP_STAT_CRC)
        printf("crc: '%0x'\n", sb.crc);
    if (sb.valid & ZIP_STAT_COMP_METHOD)
        printf("compression method: '%d'\n", sb.comp_method);
    if (sb.valid & ZIP_STAT_ENCRYPTION_METHOD)
        printf("encryption method: '%d'\n", sb.encryption_method);
    if (sb.valid & ZIP_STAT_FLAGS)
        printf("flags: '%ld'\n", (long)sb.flags);
    printf("\n");

    return 0;
}